

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_logging.cc
# Opt level: O1

bool __thiscall tcmalloc::Logger::Add(Logger *this,LogItem *item)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  int base;
  uint64_t num;
  
  if (this->p_ < this->end_) {
    *this->p_ = ' ';
    this->p_ = this->p_ + 1;
  }
  switch(item->tag_) {
  case kStr:
    pcVar1 = (item->u_).str;
    sVar3 = strlen(pcVar1);
    lVar4 = (long)this->end_ - (long)this->p_;
    sVar3 = (size_t)(int)sVar3;
    if ((long)sVar3 <= lVar4) {
      memcpy(this->p_,pcVar1,sVar3);
      this->p_ = this->p_ + sVar3;
      return (long)sVar3 <= lVar4;
    }
    return (long)sVar3 <= lVar4;
  case kSigned:
    num = (item->u_).unum;
    if ((long)num < 0) {
      pcVar1 = this->p_;
      if (this->end_ == pcVar1 || (long)this->end_ - (long)pcVar1 < 0) {
        return false;
      }
      *pcVar1 = '-';
      this->p_ = this->p_ + 1;
      num = -(item->u_).snum;
    }
    break;
  case kUnsigned:
    num = (item->u_).unum;
    break;
  case kPtr:
    pcVar1 = this->p_;
    if ((long)this->end_ - (long)pcVar1 < 2) {
      return false;
    }
    pcVar1[0] = '0';
    pcVar1[1] = 'x';
    this->p_ = this->p_ + 2;
    num = (item->u_).unum;
    base = 0x10;
    goto LAB_0011a6e0;
  default:
    return false;
  }
  base = 10;
LAB_0011a6e0:
  bVar2 = AddNum(this,num,base);
  return bVar2;
}

Assistant:

bool Logger::Add(const LogItem& item) {
  // Separate items with spaces
  if (p_ < end_) {
    *p_ = ' ';
    p_++;
  }

  switch (item.tag_) {
    case LogItem::kStr:
      return AddStr(item.u_.str, strlen(item.u_.str));
    case LogItem::kUnsigned:
      return AddNum(item.u_.unum, 10);
    case LogItem::kSigned:
      if (item.u_.snum < 0) {
        // The cast to uint64_t is intentionally before the negation
        // so that we do not attempt to negate -2^63.
        return AddStr("-", 1)
            && AddNum(- static_cast<uint64_t>(item.u_.snum), 10);
      } else {
        return AddNum(static_cast<uint64_t>(item.u_.snum), 10);
      }
    case LogItem::kPtr:
      return AddStr("0x", 2)
          && AddNum(reinterpret_cast<uintptr_t>(item.u_.ptr), 16);
    default:
      return false;
  }
}